

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
getShaderInitialization_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType)

{
  bool bVar1;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar2;
  undefined1 local_198 [8];
  ostringstream source;
  ShaderType shaderType_local;
  NegativeTestContext *ctx_local;
  
  source._372_4_ = SUB84(ctx,0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  pRVar2 = NegativeTestContext::getRenderContext((NegativeTestContext *)this);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  if (!bVar1) {
    if (source._372_4_ == 2) {
      std::operator<<((ostream *)local_198,"#extension GL_EXT_geometry_shader : enable\n");
    }
    else if (source._372_4_ == 3) {
      std::operator<<((ostream *)local_198,"#extension GL_EXT_tessellation_shader : enable\n");
    }
    else if (source._372_4_ == 4) {
      std::operator<<((ostream *)local_198,"#extension GL_EXT_tessellation_shader : enable\n");
    }
  }
  if (source._372_4_ == 2) {
    std::operator<<((ostream *)local_198,"layout(max_vertices = 5) out;\n");
  }
  else if (source._372_4_ == 3) {
    std::operator<<((ostream *)local_198,"layout(vertices = 3) out;\n");
  }
  else if (source._372_4_ == 4) {
    std::operator<<((ostream *)local_198,"layout(triangles, equal_spacing, cw) in;\n");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string getShaderInitialization (NegativeTestContext& ctx, glu::ShaderType shaderType)
{
	std::ostringstream source;

	if (!contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		switch (shaderType)
		{
			case glu::SHADERTYPE_GEOMETRY:
				source << "#extension GL_EXT_geometry_shader : enable\n";
				break;

			case glu::SHADERTYPE_TESSELLATION_CONTROL:
				source << "#extension GL_EXT_tessellation_shader : enable\n";
				break;

			case glu::SHADERTYPE_TESSELLATION_EVALUATION:
				source << "#extension GL_EXT_tessellation_shader : enable\n";
				break;

			default:
				break;
		}
	}

	switch (shaderType)
	{
		case glu::SHADERTYPE_GEOMETRY:
			source << "layout(max_vertices = 5) out;\n";
			break;

		case glu::SHADERTYPE_TESSELLATION_CONTROL:
			source << "layout(vertices = 3) out;\n";
			break;

		case glu::SHADERTYPE_TESSELLATION_EVALUATION:
			source << "layout(triangles, equal_spacing, cw) in;\n";
			break;

		default:
			break;
	}

	return source.str();
}